

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

ObjFunction * compile(char *source)

{
  long lVar1;
  ObjFunction *pOVar2;
  Compiler compiler;
  Compiler local_2230;
  
  initScanner(source);
  local_2230.enclosing = current;
  local_2230.function = (ObjFunction *)0x0;
  local_2230.type = TYPE_SCRIPT;
  local_2230.localCount = 0;
  local_2230.scopeDepth = 0;
  local_2230.function = newFunction();
  lVar1 = (long)local_2230.localCount;
  local_2230.localCount = local_2230.localCount + 1;
  local_2230.locals[lVar1].depth = 0;
  local_2230.locals[lVar1].isCaptured = false;
  local_2230.locals[lVar1].name.start = "this";
  local_2230.locals[lVar1].name.length = 4;
  parser.hadError = false;
  parser.panicMode = false;
  current = &local_2230;
  advance();
  while (parser.current.type != TOKEN_EOF) {
    declaration();
  }
  advance();
  emitReturn();
  if (parser.hadError == false) {
    pOVar2 = current->function;
  }
  else {
    pOVar2 = (ObjFunction *)0x0;
  }
  current = current->enclosing;
  return pOVar2;
}

Assistant:

ObjFunction *compile(const char *source) {
    initScanner(source);
    Compiler compiler;
    initCompiler(&compiler, TYPE_SCRIPT);
    parser.hadError = false;
    parser.panicMode = false;
    advance();
    while (!match(TOKEN_EOF)) {
        declaration();
    }
    ObjFunction *function = endCompiler();
    return parser.hadError ? NULL : function;
}